

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON **ppcVar1;
  cJSON *pcVar2;
  cJSON_bool cVar3;
  cJSON *pcVar4;
  ulong uVar5;
  bool bVar6;
  
  if (newitem == (cJSON *)0x0 || which < 0) {
    return 0;
  }
  if (array != (cJSON *)0x0) {
    uVar5 = (ulong)(uint)which;
    ppcVar1 = &array->child;
    pcVar4 = (cJSON *)ppcVar1;
    do {
      pcVar4 = pcVar4->next;
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
      if (pcVar4 == (cJSON *)0x0) break;
    } while (bVar6);
    if (pcVar4 != (cJSON *)0x0) {
      if (pcVar4 == *ppcVar1) {
        newitem->next = pcVar4;
        newitem->prev = pcVar4->prev;
        pcVar4->prev = newitem;
        *ppcVar1 = newitem;
      }
      else {
        pcVar2 = pcVar4->prev;
        if (pcVar2 == (cJSON *)0x0) {
          return 0;
        }
        newitem->next = pcVar4;
        newitem->prev = pcVar2;
        pcVar4->prev = newitem;
        newitem->prev->next = newitem;
      }
      return 1;
    }
  }
  cVar3 = add_item_to_array(array,newitem);
  return cVar3;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0 || newitem == NULL)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    if (after_inserted != array->child && after_inserted->prev == NULL) {
        /* return false if after_inserted is a corrupted array item */
        return false;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}